

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O0

void __thiscall luna::Library::RegisterString(Library *this,Table *table,char *name,char *str)

{
  anon_union_8_9_8deb4486_for_Value_0 this_00;
  Value v;
  Value k;
  anon_union_8_9_8deb4486_for_Value_0 local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  anon_union_8_9_8deb4486_for_Value_0 in_stack_ffffffffffffffd0;
  
  Value::Value((Value *)&stack0xffffffffffffffd0);
  this_00.obj_ = &State::GetString(in_stack_ffffffffffffffd0.obj_,
                                   (char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                    in_stack_ffffffffffffffc8))->super_GCObject;
  Value::Value((Value *)&local_40);
  local_40.obj_ =
       &State::GetString(this_00.obj_,(char *)CONCAT44(in_stack_ffffffffffffffcc,4))->super_GCObject
  ;
  Table::SetValue((Table *)this,(Value *)table,(Value *)name);
  return;
}

Assistant:

void Library::RegisterString(Table *table, const char *name, const char *str)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = state_->GetString(name);

        Value v;
        v.type_ = ValueT_String;
        v.str_ = state_->GetString(str);
        table->SetValue(k, v);
    }